

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_BtFindBestMatch_extDict_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint uVar1;
  U32 mls;
  size_t sVar2;
  
  uVar1 = (ms->cParams).minMatch;
  if (uVar1 - 6 < 2) {
    if (ip < (ms->window).base + ms->nextToUpdate) {
      return 0;
    }
    mls = 6;
  }
  else if (uVar1 == 5) {
    if (ip < (ms->window).base + ms->nextToUpdate) {
      return 0;
    }
    mls = 5;
  }
  else {
    if (ip < (ms->window).base + ms->nextToUpdate) {
      return 0;
    }
    mls = 4;
  }
  ZSTD_updateDUBT(ms,ip,iLimit,mls);
  sVar2 = ZSTD_DUBT_findBestMatch(ms,ip,iLimit,offsetPtr,mls,ZSTD_extDict);
  return sVar2;
}

Assistant:

static size_t ZSTD_BtFindBestMatch_extDict_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 4, ZSTD_extDict);
    case 5 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 5, ZSTD_extDict);
    case 7 :
    case 6 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 6, ZSTD_extDict);
    }
}